

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               Geometry *crse_geom)

{
  uint num_comp;
  FabArray<amrex::FArrayBox> *this;
  bool bVar1;
  FabArray<amrex::FArrayBox> *src;
  MultiFab *this_00;
  int idim;
  long lVar2;
  Periodicity PVar3;
  BoxArray cba;
  Array<MultiFab,_3> ctmp;
  undefined **local_548;
  undefined8 local_540;
  undefined8 local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_530;
  FabArray<amrex::FArrayBox> *local_518 [13];
  array<amrex::MultiFab,_3UL> local_4b0;
  
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>);
  if (bVar1) {
    num_comp = (crse->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    this_00 = local_4b0._M_elems;
    std::array<amrex::MultiFab,_3UL>::array((array<amrex::MultiFab,_3UL> *)this_00);
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      BoxArray::BoxArray((BoxArray *)local_518,
                         &(fine->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>).
                          super_FabArrayBase.boxarray);
      BoxArray::coarsen((BoxArray *)local_518,ratio);
      local_540 = 1;
      vStack_530.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_530.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_538 = 0;
      vStack_530.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_548 = &PTR__FabFactory_007d2928;
      (*(((FabArray<amrex::FArrayBox> *)
         &(this_00->super_FabArray<amrex::FArrayBox>).super_FabArrayBase)->super_FabArrayBase).
        _vptr_FabArrayBase[2])
                (this_00,(BoxArray *)local_518,
                 &(fine->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                  distributionMap,(ulong)num_comp,0,&local_540,&local_548);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_530);
      BoxArray::~BoxArray((BoxArray *)local_518);
      this_00 = this_00 + 1;
    }
    src = (FabArray<amrex::FArrayBox> *)&local_4b0;
    local_518[1] = &local_4b0._M_elems[1].super_FabArray<amrex::FArrayBox>;
    local_518[2] = &local_4b0._M_elems[2].super_FabArray<amrex::FArrayBox>;
    local_518[0] = src;
    EB_average_down_faces(fine,(Array<MultiFab_*,_3> *)local_518,ratio,0);
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      this = &crse->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>;
      PVar3 = Geometry::periodicity(crse_geom);
      local_518[0] = PVar3.period.vect._0_8_;
      local_518[1]._0_4_ = PVar3.period.vect[2];
      FabArray<amrex::FArrayBox>::ParallelCopy(this,src,0,0,num_comp,(Periodicity *)local_518,COPY);
      src = src + 1;
    }
    std::array<amrex::MultiFab,_3UL>::~array(&local_4b0);
    return;
  }
  average_down_faces(fine,crse,ratio,crse_geom);
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, const Geometry& crse_geom)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, crse_geom);
    }
    else
    {
        int ngcrse = 0;
        int ncomp = crse[0]->nComp();
        Array<MultiFab,AMREX_SPACEDIM> ctmp;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            BoxArray cba = fine[idim]->boxArray();
            cba.coarsen(ratio);
            ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
        }
        EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,crse_geom.periodicity());
        }
    }
}